

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

CURLcode Curl_conn_send(Curl_easy *data,int sockindex,void *buf,size_t blen,_Bool eos,
                       size_t *pnwritten)

{
  ssize_t local_60;
  connectdata *conn;
  CURLcode result;
  ssize_t nwritten;
  size_t write_len;
  size_t *pnwritten_local;
  size_t sStack_28;
  _Bool eos_local;
  size_t blen_local;
  void *buf_local;
  Curl_easy *pCStack_10;
  int sockindex_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  nwritten = blen;
  write_len = (size_t)pnwritten;
  pnwritten_local._7_1_ = eos;
  sStack_28 = blen;
  blen_local = (size_t)buf;
  buf_local._4_4_ = sockindex;
  pCStack_10 = data;
  local_60 = (*data->conn->send[sockindex])
                       (data,sockindex,buf,blen,eos,(CURLcode *)((long)&conn + 4));
  if (local_60 < 0) {
    local_60 = 0;
  }
  *(ssize_t *)write_len = local_60;
  return conn._4_4_;
}

Assistant:

CURLcode Curl_conn_send(struct Curl_easy *data, int sockindex,
                        const void *buf, size_t blen, bool eos,
                        size_t *pnwritten)
{
  size_t write_len = blen;
  ssize_t nwritten;
  CURLcode result = CURLE_OK;
  struct connectdata *conn;

  DEBUGASSERT(sockindex >= 0 && sockindex < 2);
  DEBUGASSERT(pnwritten);
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  conn = data->conn;
#ifdef DEBUGBUILD
  {
    /* Allow debug builds to override this logic to force short sends
    */
    char *p = getenv("CURL_SMALLSENDS");
    if(p) {
      size_t altsize = (size_t)strtoul(p, NULL, 10);
      if(altsize)
        write_len = CURLMIN(write_len, altsize);
    }
  }
#endif
  if(write_len != blen)
    eos = FALSE;
  nwritten = conn->send[sockindex](data, sockindex, buf, write_len, eos,
                                   &result);
  DEBUGASSERT((nwritten >= 0) || result);
  *pnwritten = (nwritten < 0) ? 0 : (size_t)nwritten;
  return result;
}